

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&this->super_IfcConstructionResource = pvVar1;
  *(void **)(&(this->super_IfcConstructionResource).field_0x0 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x21];
  *(void **)&(this->super_IfcConstructionResource).field_0x88 = vtt[0x22];
  *(void **)&(this->super_IfcConstructionResource).field_0x98 = vtt[0x23];
  *(void **)&(this->super_IfcConstructionResource).field_0xd0 = vtt[0x24];
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x25];
  *(void **)&(this->super_IfcConstructionResource).field_0x178 = vtt[0x26];
  std::__cxx11::string::~string((string *)&this->JobDescription);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_0x190);
  IfcConstructionResource::~IfcConstructionResource(&this->super_IfcConstructionResource,vtt + 1);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}